

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

size_t __thiscall
CoreML::Specification::RangeDynamicLayerParams::ByteSizeLong(RangeDynamicLayerParams *this)

{
  ulong uVar1;
  size_t sVar2;
  
  uVar1 = (ulong)(this->startvalue_ != 0.0);
  sVar2 = uVar1 * 5 + 5;
  if (this->stepsizevalue_ == 0.0) {
    sVar2 = uVar1 * 5;
  }
  uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar1 & 1) != 0) {
    sVar2 = sVar2 + *(long *)((uVar1 & 0xfffffffffffffffc) + 0x10);
  }
  (this->_cached_size_).size_.super___atomic_base<int>._M_i = (__int_type)sVar2;
  return sVar2;
}

Assistant:

size_t RangeDynamicLayerParams::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.RangeDynamicLayerParams)
  size_t total_size = 0;

  uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  // float startValue = 2;
  static_assert(sizeof(uint32_t) == sizeof(float), "Code assumes uint32_t and float are the same size.");
  float tmp_startvalue = this->_internal_startvalue();
  uint32_t raw_startvalue;
  memcpy(&raw_startvalue, &tmp_startvalue, sizeof(tmp_startvalue));
  if (raw_startvalue != 0) {
    total_size += 1 + 4;
  }

  // float stepSizeValue = 3;
  static_assert(sizeof(uint32_t) == sizeof(float), "Code assumes uint32_t and float are the same size.");
  float tmp_stepsizevalue = this->_internal_stepsizevalue();
  uint32_t raw_stepsizevalue;
  memcpy(&raw_stepsizevalue, &tmp_stepsizevalue, sizeof(tmp_stepsizevalue));
  if (raw_stepsizevalue != 0) {
    total_size += 1 + 4;
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    total_size += _internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size();
  }
  int cached_size = ::PROTOBUF_NAMESPACE_ID::internal::ToCachedSize(total_size);
  SetCachedSize(cached_size);
  return total_size;
}